

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O1

int IDAGetLastLinFlag(void *ida_mem,long *flag)

{
  int iVar1;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  IDALsMem local_18;
  IDAMem local_10;
  
  iVar1 = idaLs_AccessLMem(ida_mem,"IDAGetLastLinFlag",&local_10,&local_18);
  if (iVar1 == 0) {
    *flag = (long)local_18->last_flag;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int IDAGetLastLinFlag(void* ida_mem, long int* flag)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure; store output and return */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }
  *flag = idals_mem->last_flag;
  return (IDALS_SUCCESS);
}